

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O3

void __thiscall
flow_cutter::DistanceAwareCutter::
DistanceAwareCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
          (DistanceAwareCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  
  BasicCutter::
  BasicCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
            (&this->cutter,graph);
  iVar1 = (graph->tail).original_node_count;
  uVar2 = iVar1 * 2;
  this->node_dist[0].preimage_count_ = uVar2;
  if (iVar1 == 0) {
    this->node_dist[0].data_ = (int *)0x0;
    this->node_dist[1].preimage_count_ = uVar2;
    piVar3 = (int *)0x0;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar5 = (ulong)uVar2 << 2;
    }
    piVar3 = (int *)operator_new__(uVar5);
    this->node_dist[0].data_ = piVar3;
    this->node_dist[1].preimage_count_ = uVar2;
    piVar3 = (int *)operator_new__(uVar5);
  }
  this->node_dist[1].data_ = piVar3;
  (this->rng)._M_x[0] = 0x1571;
  uVar5 = 0x1571;
  lVar4 = 0x28;
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4) - 0x27);
    *(ulong *)(&(this->cutter).assimilated[0].node_set.node_count_inside_ + lVar4 * 2) = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x297);
  (this->rng)._M_p = 0x270;
  return;
}

Assistant:

DistanceAwareCutter(const Graph& graph)
        : cutter(graph)
        , node_dist { ArrayIDFunc<int> { graph.node_count() },
            ArrayIDFunc<int> { graph.node_count() } }
    {
    }